

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.h
# Opt level: O1

bool mdns::sendData(int fd,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  pointer __buf;
  ssize_t sVar1;
  sockaddr_in broadcastAddr;
  undefined1 local_28 [8];
  char acStack_20 [16];
  
  acStack_20[0] = '\0';
  acStack_20[1] = '\0';
  acStack_20[2] = '\0';
  acStack_20[3] = '\0';
  acStack_20[4] = '\0';
  acStack_20[5] = '\0';
  acStack_20[6] = '\0';
  acStack_20[7] = '\0';
  local_28._0_2_ = 2;
  local_28[2] = '\x14';
  local_28[3] = -0x17;
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  inet_aton("224.0.0.251",(in_addr *)(local_28 + 4));
  __buf = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start;
  sVar1 = sendto(fd,__buf,(long)(data->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)__buf,0,
                 (sockaddr *)local_28,0x10);
  if (sVar1 < 0) {
    perror(" ! Failed to send request");
  }
  return -1 < sVar1;
}

Assistant:

bool sendData(const int fd, const std::vector<uint8_t> &data)
{
    sockaddr_in broadcastAddr{};
    broadcastAddr.sin_family = AF_INET;
    broadcastAddr.sin_port = htons(5353);
    inet_aton("224.0.0.251", &broadcastAddr.sin_addr);

    long st = sendto(
            fd,
            data.data(),
            data.size(),
            0,
            reinterpret_cast<const sockaddr*>(&broadcastAddr),
            sizeof(broadcastAddr));

    // todo check length
    if (st < 0) {
        perror(" ! Failed to send request");
        return false;
    }

    return true;
}